

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O1

int test_kvtree_util_set_get_ptr(void)

{
  int iVar1;
  int rc;
  kvtree *kvtree;
  void *roundtrip;
  int local_1c;
  long local_18;
  int *local_10;
  
  local_1c = 0;
  local_10 = (int *)0x0;
  local_18 = kvtree_new();
  if (local_18 == 0) {
    local_1c = 1;
  }
  iVar1 = kvtree_util_set_ptr(local_18,"KEY",&local_1c);
  if (iVar1 != 0) {
    local_1c = 1;
  }
  iVar1 = kvtree_util_get_ptr(local_18,"KEY",&local_10);
  if (iVar1 != 0) {
    local_1c = 1;
  }
  if (local_10 != &local_1c) {
    local_1c = 1;
  }
  kvtree_delete(&local_18);
  return local_1c;
}

Assistant:

int test_kvtree_util_set_get_ptr(){
  int rc = TEST_PASS;
  char* key = "KEY";
  void* value = (void*) &rc; /* any memory pointer will do, just use address of rc */
  void* roundtrip = NULL;

  kvtree* kvtree = kvtree_new();

  if(kvtree == NULL) rc = TEST_FAIL;
  if(kvtree_util_set_ptr(kvtree, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(kvtree_util_get_ptr(kvtree, key, &roundtrip) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(roundtrip != value) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  return rc;
}